

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void __thiscall
PField::PField(PField *this,FName *name,PType *type,DWORD flags,size_t offset,int bitvalue)

{
  uint uVar1;
  PClass *pPVar2;
  int iVar3;
  PClass *pPVar4;
  FName local_34;
  
  PSymbol::PSymbol(&this->super_PSymbol,&local_34);
  (this->super_PSymbol).super_PTypeBase.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_006ee128;
  this->Offset = offset;
  this->Type = type;
  this->Flags = flags;
  if (bitvalue == 0) {
    this->BitValue = -1;
  }
  else {
    iVar3 = 0;
    for (; 1 < (uint)bitvalue; bitvalue = (uint)bitvalue >> 1) {
      iVar3 = iVar3 + 1;
    }
    this->BitValue = iVar3;
    pPVar2 = PInt::RegistrationInfo.MyClass;
    pPVar4 = DObject::GetClass((DObject *)type);
    if ((pPVar4 == pPVar2) &&
       (uVar1 = this->BitValue,
       uVar1 < (uint)(*(int *)&(type->super_PTypeBase).super_DObject.field_0x24 << 3))) {
      this->Offset = this->Offset + (long)((int)uVar1 / 8);
      this->BitValue = uVar1 & 7;
      this->Type = (PType *)TypeBool;
    }
    else {
      I_Error("Trying to create an invalid bit field element: %s",
              FName::NameData.NameArray[name->Index].Text);
    }
  }
  return;
}

Assistant:

PField::PField(FName name, PType *type, DWORD flags, size_t offset, int bitvalue)
	: PSymbol(name), Offset(offset), Type(type), Flags(flags)
{
	if (bitvalue != 0)
	{
		BitValue = 0;
		unsigned val = bitvalue;
		while ((val >>= 1)) BitValue++;

		if (type->IsA(RUNTIME_CLASS(PInt)) && unsigned(BitValue) < 8u * type->Size)
		{
			// map to the single bytes in the actual variable. The internal bit instructions operate on 8 bit values.
#ifndef __BIG_ENDIAN__
			Offset += BitValue / 8;
#else
			Offset += type->Size - 1 - BitValue / 8;
#endif
			BitValue &= 7;
			Type = TypeBool;
		}
		else
		{
			// Just abort. Bit fields should only be defined internally.
			I_Error("Trying to create an invalid bit field element: %s", name.GetChars());
		}
	}
	else BitValue = -1;
}